

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCommandLineArguments1.cxx
# Opt level: O2

int testCommandLineArguments1(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  uint uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  int newArgc;
  int n;
  char **newArgv;
  char *m;
  string p;
  CommandLineArguments arg;
  
  cmsys::CommandLineArguments::CommandLineArguments(&arg);
  cmsys::CommandLineArguments::Initialize(&arg,argc,argv);
  n = 0;
  m = (char *)0x0;
  p._M_dataplus._M_p = (pointer)&p.field_2;
  p._M_string_length = 0;
  p.field_2._M_local_buf[0] = '\0';
  cmsys::CommandLineArguments::AddArgument(&arg,"-n",SPACE_ARGUMENT,&n,"Argument N");
  cmsys::CommandLineArguments::AddArgument(&arg,"-m",EQUAL_ARGUMENT,&m,"Argument M");
  cmsys::CommandLineArguments::AddBooleanArgument(&arg,"-p",&p,"Argument P");
  arg.StoreUnusedArgumentsFlag = true;
  iVar2 = cmsys::CommandLineArguments::Parse(&arg);
  if (iVar2 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Problem parsing arguments");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  uVar5 = (uint)(iVar2 == 0);
  if (n != 0x18) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Problem setting N. Value of N: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,n);
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar5 = 1;
  }
  if (m != (char *)0x0) {
    iVar2 = strcmp(m,"test value");
    if (iVar2 == 0) goto LAB_00122e3c;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Problem setting M. Value of M: ");
  poVar4 = std::operator<<(poVar4,m);
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar5 = 1;
LAB_00122e3c:
  bVar1 = std::operator!=(&p,"1");
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Problem setting P. Value of P: ");
    poVar4 = std::operator<<(poVar4,(string *)&p);
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar5 = 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Value of N: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,n);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Value of M: ");
  poVar4 = std::operator<<(poVar4,m);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Value of P: ");
  poVar4 = std::operator<<(poVar4,(string *)&p);
  std::endl<char,std::char_traits<char>>(poVar4);
  if (m != (char *)0x0) {
    operator_delete__(m);
  }
  newArgv = (char **)0x0;
  newArgc = 0;
  cmsys::CommandLineArguments::GetUnusedArguments(&arg,&newArgc,&newArgv);
  if (newArgc != 9) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Bad number of unused arguments: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,newArgc);
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar5 = 1;
  }
  puVar6 = &DAT_00148d20;
  uVar7 = 0;
  do {
    if ((long)newArgc <= (long)uVar7) {
      cmsys::CommandLineArguments::DeleteRemainingArguments(&arg,newArgc,&newArgv);
      std::__cxx11::string::~string((string *)&p);
      cmsys::CommandLineArguments::~CommandLineArguments(&arg);
      return uVar5;
    }
    if (newArgv[uVar7] == (char *)0x0) {
      __assert_fail("newArgv[cc]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/kwsys/testCommandLineArguments1.cxx"
                    ,0x57,"int testCommandLineArguments1(int, char **)");
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Unused argument[");
    iVar2 = (int)uVar7;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,"] = [");
    poVar4 = std::operator<<(poVar4,newArgv[uVar7]);
    poVar4 = std::operator<<(poVar4,"]");
    std::endl<char,std::char_traits<char>>(poVar4);
    if (uVar7 < 9) {
      if (uVar7 != 0) {
        __s1 = (char *)*puVar6;
        iVar3 = strcmp(__s1,newArgv[uVar7]);
        if (iVar3 != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Bad unused argument [");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
          poVar4 = std::operator<<(poVar4,"] \"");
          poVar4 = std::operator<<(poVar4,newArgv[uVar7]);
          poVar4 = std::operator<<(poVar4,"\" should be: \"");
          poVar4 = std::operator<<(poVar4,__s1);
          poVar4 = std::operator<<(poVar4,"\"");
          goto LAB_0012307e;
        }
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Too many unused arguments: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
LAB_0012307e:
      std::endl<char,std::char_traits<char>>(poVar4);
      uVar5 = 1;
    }
    uVar7 = uVar7 + 1;
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

int testCommandLineArguments1(int argc, char* argv[])
{
  kwsys::CommandLineArguments arg;
  arg.Initialize(argc, argv);

  int n = 0;
  char* m = 0;
  std::string p;
  int res = 0;

  typedef kwsys::CommandLineArguments argT;
  arg.AddArgument("-n", argT::SPACE_ARGUMENT, &n, "Argument N");
  arg.AddArgument("-m", argT::EQUAL_ARGUMENT, &m, "Argument M");
  arg.AddBooleanArgument("-p", &p, "Argument P");

  arg.StoreUnusedArguments(true);

  if ( !arg.Parse() )
    {
    std::cerr << "Problem parsing arguments" << std::endl;
    res = 1;
    }
  if ( n != 24 )
    {
    std::cout << "Problem setting N. Value of N: " << n << std::endl;
    res = 1;
    }
  if ( !m || strcmp(m, "test value") != 0 )
    {
    std::cout << "Problem setting M. Value of M: " << m << std::endl;
    res = 1;
    }
  if ( p != "1" )
    {
    std::cout << "Problem setting P. Value of P: " << p << std::endl;
    res = 1;
    }
  std::cout << "Value of N: " << n << std::endl;
  std::cout << "Value of M: " << m << std::endl;
  std::cout << "Value of P: " << p << std::endl;
  if ( m )
    {
    delete [] m;
    }

  char** newArgv = 0;
  int newArgc = 0;
  arg.GetUnusedArguments(&newArgc, &newArgv);
  int cc;
  const char* valid_unused_args[9] = {
    0, "--ignored", "--second-ignored", "third-ignored",
    "some", "junk", "at", "the", "end"
  };
  if ( newArgc != 9 )
    {
    std::cerr << "Bad number of unused arguments: " << newArgc << std::endl;
    res = 1;
    }
  for ( cc = 0; cc < newArgc; ++ cc )
    {
    assert(newArgv[cc]); /* Quiet Clang scan-build. */
    std::cout << "Unused argument[" << cc << "] = [" << newArgv[cc] << "]"
      << std::endl;
    if ( cc >= 9 )
      {
      std::cerr << "Too many unused arguments: " << cc << std::endl;
      res = 1;
      }
    else if ( valid_unused_args[cc] &&
      strcmp(valid_unused_args[cc], newArgv[cc]) != 0 )
      {
      std::cerr << "Bad unused argument [" << cc << "] \""
        << newArgv[cc] << "\" should be: \"" << valid_unused_args[cc] << "\""
        << std::endl;
      res = 1;
      }
    }
  arg.DeleteRemainingArguments(newArgc, &newArgv);

  return res;
}